

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.hpp
# Opt level: O1

Value<char> * __thiscall Qentem::Value<char>::operator=(Value<char> *this,Value<char> *val)

{
  ValueType VVar1;
  
  if (this != val) {
    VVar1 = val->type_;
    val->type_ = Undefined;
    reset(this);
    this->type_ = VVar1;
    if (VVar1 == String) {
      String<char>::deallocate((String<char> *)this);
      (this->field_0).array_.storage_ = (val->field_0).array_.storage_;
      (this->field_0).array_.index_ = (val->field_0).array_.index_;
      (val->field_0).array_.storage_ = (Value<char> *)0x0;
      (val->field_0).array_.index_ = 0;
    }
    else if (VVar1 == Array) {
      Array<Qentem::Value<char>_>::operator=
                ((Array<Qentem::Value<char>_> *)this,(Array<Qentem::Value<char>_> *)val);
    }
    else if (VVar1 == Object) {
      HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
      ::operator=((HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
                   *)this,(HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
                           *)val);
    }
    else {
      (this->field_0).array_.storage_ = (val->field_0).array_.storage_;
    }
  }
  return this;
}

Assistant:

Value &operator=(Value &&val) noexcept {
        if (this != &val) {
            const ValueType type = val.Type();

            val.setTypeToUndefined();

            reset();
            setType(type);

            switch (type) {
                case ValueType::Object: {
                    object_ = Memory::Move(val.object_);
                    break;
                }

                case ValueType::Array: {
                    array_ = Memory::Move(val.array_);
                    break;
                }

                case ValueType::String: {
                    string_ = Memory::Move(val.string_);
                    break;
                }

                default: {
                    number_ = val.number_;
                }
            }
        }

        return *this;
    }